

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_SetNonlinearSolver(ARKodeMem ark_mem,SUNNonlinearSolver NLS)

{
  int iVar1;
  ARKodeMem in_RSI;
  ARKodeMem in_RDI;
  int retval;
  ARKodeARKStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_RSI,in_stack_ffffffffffffffe0,
                       (ARKodeARKStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (in_RSI == (ARKodeMem)0x0) {
      arkProcessError(in_RDI,-0x16,0x30,"arkStep_SetNonlinearSolver",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                      ,"The NLS input must be non-NULL");
      local_4 = -0x16;
    }
    else if (((*(long *)in_RSI->uround == 0) || (*(long *)((long)in_RSI->uround + 0x18) == 0)) ||
            (*(long *)((long)in_RSI->uround + 0x28) == 0)) {
      arkProcessError(in_RDI,-0x16,0x39,"arkStep_SetNonlinearSolver",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                      ,"NLS does not support required operations");
      local_4 = -0x16;
    }
    else {
      if ((*(long *)(in_stack_ffffffffffffffe0 + 0x88) != 0) &&
         (*(int *)(in_stack_ffffffffffffffe0 + 0x90) != 0)) {
        SUNNonlinSolFree(*(undefined8 *)(in_stack_ffffffffffffffe0 + 0x88));
      }
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0x88) = in_RSI;
      in_stack_ffffffffffffffe0[0x90] = '\0';
      in_stack_ffffffffffffffe0[0x91] = '\0';
      in_stack_ffffffffffffffe0[0x92] = '\0';
      in_stack_ffffffffffffffe0[0x93] = '\0';
      iVar1 = SUNNonlinSolSetConvTestFn
                        (*(undefined8 *)(in_stack_ffffffffffffffe0 + 0x88),arkStep_NlsConvTest,
                         in_RDI);
      if (iVar1 == 0) {
        iVar1 = SUNNonlinSolSetMaxIters
                          (*(undefined8 *)(in_stack_ffffffffffffffe0 + 0x88),
                           *(undefined4 *)(in_stack_ffffffffffffffe0 + 0x108));
        if (iVar1 == 0) {
          if (*(long *)(in_stack_ffffffffffffffe0 + 8) == 0) {
            arkProcessError(in_RDI,-0x16,0x5e,"arkStep_SetNonlinearSolver",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                            ,"The implicit ODE RHS function is NULL");
            local_4 = -0x16;
          }
          else {
            *(undefined8 *)(in_stack_ffffffffffffffe0 + 0x98) =
                 *(undefined8 *)(in_stack_ffffffffffffffe0 + 8);
            local_4 = 0;
          }
        }
        else {
          arkProcessError(in_RDI,-0x16,0x56,"arkStep_SetNonlinearSolver",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                          ,"Setting maximum number of nonlinear iterations failed");
          local_4 = -0x16;
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,0x4d,"arkStep_SetNonlinearSolver",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                        ,"Setting convergence test function failed");
        local_4 = -0x16;
      }
    }
  }
  return local_4;
}

Assistant:

int arkStep_SetNonlinearSolver(ARKodeMem ark_mem, SUNNonlinearSolver NLS)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately if NLS input is NULL */
  if (NLS == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The NLS input must be non-NULL");
    return (ARK_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if ((NLS->ops->gettype == NULL) || (NLS->ops->solve == NULL) ||
      (NLS->ops->setsysfn == NULL))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "NLS does not support required operations");
    return (ARK_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
  {
    retval = SUNNonlinSolFree(step_mem->NLS);
  }

  /* set SUNNonlinearSolver pointer */
  step_mem->NLS    = NLS;
  step_mem->ownNLS = SUNFALSE;

  /* set default convergence test function */
  retval = SUNNonlinSolSetConvTestFn(step_mem->NLS, arkStep_NlsConvTest,
                                     (void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting convergence test function failed");
    return (ARK_ILL_INPUT);
  }

  /* set default nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(step_mem->NLS, step_mem->maxcor);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting maximum number of nonlinear iterations failed");
    return (ARK_ILL_INPUT);
  }

  /* set the nonlinear system RHS function */
  if (!(step_mem->fi))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The implicit ODE RHS function is NULL");
    return (ARK_ILL_INPUT);
  }
  step_mem->nls_fi = step_mem->fi;

  return (ARK_SUCCESS);
}